

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

AggregateInitialiserList * __thiscall
soul::ModuleCloner::cloneInitialiserList(ModuleCloner *this,AggregateInitialiserList *old)

{
  size_t sVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  size_t sVar3;
  AggregateInitialiserList *pAVar4;
  Expression *pEVar5;
  long lVar6;
  
  pAVar4 = PoolAllocator::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                     (&this->newModule->allocator->pool,
                      &(old->super_Expression).super_Object.location,&old->type);
  sVar1 = (old->items).numActive;
  if (sVar1 != 0) {
    ppVar2 = (old->items).items;
    lVar6 = 0;
    do {
      pEVar5 = cloneExpression(this,*(Expression **)((long)&ppVar2->object + lVar6));
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                (&pAVar4->items,(pAVar4->items).numActive + 1);
      sVar3 = (pAVar4->items).numActive;
      (pAVar4->items).items[sVar3].object = pEVar5;
      (pAVar4->items).numActive = sVar3 + 1;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  return pAVar4;
}

Assistant:

heart::AggregateInitialiserList& cloneInitialiserList (const heart::AggregateInitialiserList& old)
    {
        auto& l = newModule.allocate<heart::AggregateInitialiserList> (old.location, old.type);

        for (auto& i : old.items)
            l.items.push_back (cloneExpression (i));

        return l;
    }